

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_get_file_byte_offset(coda_cursor *cursor,int64_t *byte_offset)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  long lVar3;
  uint uVar4;
  undefined8 uVar5;
  char *message;
  
  if ((cursor != (coda_cursor *)0x0) && (0 < cursor->n)) {
    uVar4 = cursor->n - 1;
    pcVar2 = cursor->stack[uVar4].type;
    if (pcVar2 != (coda_dynamic_type_struct *)0x0) {
      if (byte_offset != (int64_t *)0x0) {
        cVar1 = pcVar2->backend;
        if (cVar1 - coda_backend_memory < 6) {
          *byte_offset = -1;
          return -1;
        }
        if (cVar1 < 2) {
          lVar3 = cursor->stack[uVar4].bit_offset;
          if (lVar3 == -1) {
            *byte_offset = -1;
            return 0;
          }
          *byte_offset = lVar3 >> 3;
          return 0;
        }
        return 0;
      }
      message = "byte_offset argument is NULL (%s:%u)";
      uVar5 = 0x754;
      goto LAB_0012e28e;
    }
  }
  message = "invalid cursor argument (%s:%u)";
  uVar5 = 0x74e;
LAB_0012e28e:
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar5);
  return -1;
}

Assistant:

int coda_cursor_get_file_byte_offset(const coda_cursor *cursor, int64_t *byte_offset)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (byte_offset == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "byte_offset argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            if (cursor->stack[cursor->n - 1].bit_offset == -1)
            {
                *byte_offset = -1;
            }
            else
            {
                *byte_offset = (cursor->stack[cursor->n - 1].bit_offset >> 3);
            }
            break;
        case coda_backend_memory:
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            *byte_offset = -1;
            return -1;
    }

    return 0;
}